

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureCalc.h
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmTextureCalc::ScaleFCRectHeight
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t Height)

{
  uint uVar1;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    uVar1 = 0;
  }
  else {
    if (pTexInfo->TileMode == LEGACY_TILE_Y) {
      uVar1 = Height + 0x7f >> 6;
    }
    else {
      if (pTexInfo->TileMode != LEGACY_TILE_X) {
        return Height;
      }
      uVar1 = Height + 0x3f >> 5;
    }
    uVar1 = uVar1 & 0xfffffffe;
  }
  return uVar1;
}

Assistant:

virtual uint32_t GMM_STDCALL ScaleFCRectHeight(GMM_TEXTURE_INFO * pTexInfo, uint32_t Height)
            {
                __GMM_ASSERTPTR(pTexInfo, 0);
                uint32_t ScaledHeight = Height;

                if (pTexInfo->TileMode == LEGACY_TILE_X)
                {
                    const uint16_t FastClearRccTileXAlignHeight = 64; // lines - RCC ( Render Color Cache ) Alignment Sizes
                    const uint16_t TileXClearHeightScale = 32;         // lines - Clear & Resolve Rect Scaling Sizes

                    ScaledHeight = GFX_ALIGN(ScaledHeight, FastClearRccTileXAlignHeight);
                    ScaledHeight /= TileXClearHeightScale;
                }
                else if (pTexInfo->TileMode == LEGACY_TILE_Y)
                {
                    const uint16_t FastClearRccTileYAlignHeight = 128; // bits
                    const uint16_t TileYClearHeightScale = 64;        // bits

                    ScaledHeight = GFX_ALIGN(ScaledHeight, FastClearRccTileYAlignHeight);
                    ScaledHeight /= TileYClearHeightScale;
                }
                return ScaledHeight;

            }